

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

char * kvtree_elem_get_first_val(kvtree *hash,char *key)

{
  kvtree *hash_00;
  kvtree_elem *elem;
  kvtree_elem *e;
  kvtree *h;
  char *v;
  char *key_local;
  kvtree *hash_local;
  
  h = (kvtree *)0x0;
  hash_00 = kvtree_get(hash,key);
  if ((hash_00 != (kvtree *)0x0) && (elem = kvtree_elem_first(hash_00), elem != (kvtree_elem *)0x0))
  {
    h = (kvtree *)kvtree_elem_key(elem);
  }
  return (char *)h;
}

Assistant:

char* kvtree_elem_get_first_val(const kvtree* hash, const char* key)
{
  /* lookup the hash, then return a pointer to the key of the first
   * element */
  char* v = NULL;
  kvtree* h = kvtree_get(hash, key);
  if (h != NULL) {
    kvtree_elem* e = kvtree_elem_first(h);
    if (e != NULL) {
      v = kvtree_elem_key(e);
    }
  }
  return v;
}